

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testInit(VaryingLocationLimitTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
  *this_00;
  GLuint stage;
  STAGES SVar1;
  GLuint index;
  Type TVar2;
  value_type local_58;
  value_type local_44;
  
  this_00 = &this->m_test_cases;
  index = 0;
LAB_009622d3:
  if (index == 0x22) {
    return;
  }
  TVar2 = TestBase::getType((TestBase *)this,index);
  SVar1 = COMPUTE;
  do {
    if (SVar1 != COMPUTE) {
      if (SVar1 == STAGE_MAX) break;
      local_44.m_is_input = true;
      local_58.m_is_input = false;
      this = (VaryingLocationLimitTest *)this_00;
      local_58.m_type = TVar2;
      local_58.m_stage = SVar1;
      local_44.m_type = TVar2;
      local_44.m_stage = SVar1;
      std::
      vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
      ::push_back(this_00,&local_44);
      if (SVar1 != FRAGMENT) {
        this = (VaryingLocationLimitTest *)this_00;
        std::
        vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
        ::push_back(this_00,&local_58);
      }
    }
    SVar1 = SVar1 + VERTEX;
  } while( true );
  index = index + 1;
  goto LAB_009622d3;
}

Assistant:

void VaryingLocationLimitTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			testCase test_case_in  = { true, type, (Utils::Shader::STAGES)stage };
			testCase test_case_out = { false, type, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case_in);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out);
			}
		}
	}
}